

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique.hpp
# Opt level: O0

iterator __thiscall
boost::unordered::detail::
table_impl<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,double>>,unsigned_int,double,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
          (table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this,size_t key_hash,uint *k,equal_to<unsigned_int> *eq)

{
  bool bVar1;
  key_type *__y;
  size_t sVar2;
  value_type *in_RCX;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_RDX;
  size_t in_RSI;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_RDI;
  size_t node_hash;
  iterator n;
  size_t bucket_index;
  value_type *in_stack_ffffffffffffffa8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_stack_ffffffffffffffb0;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_> local_38;
  size_t local_30;
  value_type *local_28;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *local_20;
  size_t local_18;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_> local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
             ::hash_to_bucket(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  local_38.node_ =
       (node_pointer)
       table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
       ::begin(in_RDI,(size_t)in_stack_ffffffffffffffb0);
  do {
    if (local_38.node_ == (node_pointer)0x0) {
      return (iterator)(node_pointer)0x0;
    }
    if (local_18 == (local_38.node_)->hash_) {
      in_stack_ffffffffffffffa8 = local_28;
      in_stack_ffffffffffffffb0 = local_20;
      iterator_detail::
      iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>::
      operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
                 *)0x8d97a3);
      __y = table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
            ::get_key(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      bVar1 = std::equal_to<unsigned_int>::operator()
                        ((equal_to<unsigned_int> *)in_stack_ffffffffffffffa8,
                         (uint *)in_stack_ffffffffffffffb0,__y);
      if (bVar1) {
        return (iterator)local_38.node_;
      }
    }
    else {
      sVar2 = table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              ::hash_to_bucket(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      if (sVar2 != local_30) {
        iterator_detail::
        iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>::
        iterator(&local_8);
        return (iterator)local_8.node_;
      }
    }
    iterator_detail::
    iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>::
    operator++(&local_38);
  } while( true );
}

Assistant:

iterator find_node_impl(
                std::size_t key_hash,
                Key const& k,
                Pred const& eq) const
        {
            std::size_t bucket_index = this->hash_to_bucket(key_hash);
            iterator n = this->begin(bucket_index);

            for (;;)
            {
                if (!n.node_) return n;

                std::size_t node_hash = n.node_->hash_;
                if (key_hash == node_hash)
                {
                    if (eq(k, this->get_key(*n)))
                        return n;
                }
                else
                {
                    if (this->hash_to_bucket(node_hash) != bucket_index)
                        return iterator();
                }

                ++n;
            }
        }